

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void __thiscall
ImGuiInputTextCallbackData::DeleteChars(ImGuiInputTextCallbackData *this,int pos,int bytes_count)

{
  int iVar1;
  char *pcVar2;
  
  if (this->BufTextLen < bytes_count + pos) {
    __assert_fail("pos + bytes_count <= BufTextLen",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/imgui_widgets.cpp"
                  ,0xc4c,"void ImGuiInputTextCallbackData::DeleteChars(int, int)");
  }
  for (pcVar2 = this->Buf + pos; pcVar2[bytes_count] != '\0'; pcVar2 = pcVar2 + 1) {
    *pcVar2 = pcVar2[bytes_count];
  }
  *pcVar2 = '\0';
  iVar1 = this->CursorPos;
  if (iVar1 + bytes_count < pos) {
    if (iVar1 < pos) goto LAB_001355e4;
  }
  else {
    pos = iVar1 - bytes_count;
  }
  iVar1 = pos;
  this->CursorPos = iVar1;
LAB_001355e4:
  this->SelectionEnd = iVar1;
  this->SelectionStart = iVar1;
  this->BufDirty = true;
  this->BufTextLen = this->BufTextLen - bytes_count;
  return;
}

Assistant:

void ImGuiInputTextCallbackData::DeleteChars(int pos, int bytes_count)
{
    IM_ASSERT(pos + bytes_count <= BufTextLen);
    char* dst = Buf + pos;
    const char* src = Buf + pos + bytes_count;
    while (char c = *src++)
        *dst++ = c;
    *dst = '\0';

    if (CursorPos + bytes_count >= pos)
        CursorPos -= bytes_count;
    else if (CursorPos >= pos)
        CursorPos = pos;
    SelectionStart = SelectionEnd = CursorPos;
    BufDirty = true;
    BufTextLen -= bytes_count;
}